

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

void DumpLiterals(OutputStream *stream,SQObjectPtr *_literals,SQInt32 _nliterals)

{
  ulong uVar1;
  ulong uVar2;
  
  streamprintf(stream,"-----LITERALS\n");
  uVar1 = (ulong)(uint)_nliterals;
  if (_nliterals < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    streamprintf(stream,"[%d] ",uVar2 & 0xffffffff);
    DumpLiteral(stream,_literals);
    streamprintf(stream,"\n");
    _literals = _literals + 1;
  }
  return;
}

Assistant:

void DumpLiterals(OutputStream *stream, const SQObjectPtr *_literals, SQInt32 _nliterals)
{
    streamprintf(stream, _SC("-----LITERALS\n"));
    for (SQInt32 i = 0; i < _nliterals; ++i) {
        streamprintf(stream, _SC("[%d] "), (SQInt32)i);
        DumpLiteral(stream, _literals[i]);
        streamprintf(stream, _SC("\n"));
    }
}